

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::SetUniformBuffer
          (Resource *this,RefCntAutoPtr<Diligent::IDeviceObject> *_pBuffer,Uint64 _BaseOffset,
          Uint64 _RangeSize)

{
  BIND_FLAGS BVar1;
  Char *pCVar2;
  BufferVkImpl *this_00;
  BufferDesc *pBVar3;
  ulong uVar4;
  Uint64 local_100;
  ulong local_f0;
  undefined1 local_c0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  BufferVkImpl *pBuffVk;
  undefined1 local_48 [8];
  string msg;
  Uint64 _RangeSize_local;
  Uint64 _BaseOffset_local;
  RefCntAutoPtr<Diligent::IDeviceObject> *_pBuffer_local;
  Resource *this_local;
  
  msg.field_2._8_8_ = _RangeSize;
  if ((this->Type != UniformBuffer) && (this->Type != UniformBufferDynamic)) {
    FormatString<char[26],char[86]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Type == DescriptorType::UniformBuffer || Type == DescriptorType::UniformBufferDynamic"
               ,(char (*) [86])_RangeSize);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    _RangeSize = 0xcd;
    DebugAssertionFailed
              (pCVar2,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0xcd);
    std::__cxx11::string::~string((string *)local_48);
  }
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pObject,_pBuffer);
  this_00 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferVkImpl>(&this->pObject)
  ;
  if (this_00 != (BufferVkImpl *)0x0) {
    pBVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this_00);
    BVar1 = Diligent::operator&(pBVar3->BindFlags,BIND_UNIFORM_BUFFER);
    if (BVar1 == BIND_NONE) {
      FormatString<char[26],char[58]>
                ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(pBuffVk->GetDesc().BindFlags & BIND_UNIFORM_BUFFER) != 0",
                 (char (*) [58])_RangeSize);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0xd8);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if ((this->Type != UniformBufferDynamic) &&
       (pBVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                            *)this_00), pBVar3->Usage == USAGE_DYNAMIC)) {
      FormatString<char[65]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [65])"Dynamic buffer must be used with UniformBufferDynamic descriptor");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0xda);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
  }
  uVar4 = _BaseOffset + msg.field_2._8_8_;
  if (this_00 == (BufferVkImpl *)0x0) {
    local_f0 = 0;
  }
  else {
    pBVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this_00);
    local_f0 = pBVar3->Size;
  }
  if (local_f0 < uVar4) {
    FormatString<char[40]>
              ((string *)local_c0,(char (*) [40])"Specified range is out of buffer bounds");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0xde);
    std::__cxx11::string::~string((string *)local_c0);
  }
  this->BufferBaseOffset = _BaseOffset;
  this->BufferRangeSize = msg.field_2._8_8_;
  if (this->BufferRangeSize == 0) {
    if (this_00 == (BufferVkImpl *)0x0) {
      local_100 = 0;
    }
    else {
      pBVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)this_00);
      local_100 = pBVar3->Size - this->BufferBaseOffset;
    }
    this->BufferRangeSize = local_100;
  }
  this->BufferDynamicOffset = 0;
  return;
}

Assistant:

void ShaderResourceCacheVk::Resource::SetUniformBuffer(RefCntAutoPtr<IDeviceObject>&& _pBuffer, Uint64 _BaseOffset, Uint64 _RangeSize)
{
    VERIFY_EXPR(Type == DescriptorType::UniformBuffer ||
                Type == DescriptorType::UniformBufferDynamic);

    pObject = std::move(_pBuffer);

    const BufferVkImpl* pBuffVk = pObject.ConstPtr<BufferVkImpl>();

#ifdef DILIGENT_DEBUG
    if (pBuffVk != nullptr)
    {
        // VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER or VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC descriptor type require
        // buffer to be created with VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT
        VERIFY_EXPR((pBuffVk->GetDesc().BindFlags & BIND_UNIFORM_BUFFER) != 0);
        VERIFY(Type == DescriptorType::UniformBufferDynamic || pBuffVk->GetDesc().Usage != USAGE_DYNAMIC,
               "Dynamic buffer must be used with UniformBufferDynamic descriptor");
    }
#endif

    VERIFY(_BaseOffset + _RangeSize <= (pBuffVk != nullptr ? pBuffVk->GetDesc().Size : 0), "Specified range is out of buffer bounds");
    BufferBaseOffset = _BaseOffset;
    BufferRangeSize  = _RangeSize;
    if (BufferRangeSize == 0)
        BufferRangeSize = pBuffVk != nullptr ? (pBuffVk->GetDesc().Size - BufferBaseOffset) : 0;

    // Reset dynamic offset
    BufferDynamicOffset = 0;
}